

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O1

bool __thiscall CEditor::PopupSelectConfigAutoMap(CEditor *this,void *pContext,CUIRect View)

{
  IAutoMapper *pIVar1;
  int iVar2;
  CLayer *pCVar3;
  undefined4 extraout_var;
  uint Checked;
  int *pID;
  ulong uVar4;
  long in_FS_OFFSET;
  CUIRect Live;
  CUIRect Full;
  CUIRect Label;
  CUIRect Button;
  CUIRect local_88;
  CUIRect local_78;
  CUIRect local_68;
  CUIRect local_58;
  CUIRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = View;
  pCVar3 = GetSelectedLayer(this,0);
  iVar2 = (*(this->m_Map).m_lImages.list[*(int *)&pCVar3[1].m_pEditor]->m_pAutoMapper->
            _vptr_IAutoMapper[5])();
  if (0 < iVar2) {
    pID = PopupSelectConfigAutoMap::s_AutoMapperConfigButtons;
    uVar4 = 0;
    do {
      CUIRect::HSplitTop(&local_48,2.0,(CUIRect *)0x0,&local_48);
      CUIRect::HSplitTop(&local_48,12.0,&local_58,&local_48);
      pIVar1 = (this->m_Map).m_lImages.list[*(int *)&pCVar3[1].m_pEditor]->m_pAutoMapper;
      iVar2 = (*pIVar1->_vptr_IAutoMapper[6])(pIVar1,uVar4 & 0xffffffff);
      Checked = 0;
      if (pCVar3[2].m_Readonly == true) {
        Checked = (uint)(uVar4 == (uint)pCVar3[2].m_Flags);
      }
      iVar2 = DoButton_Editor(this,pID,(char *)CONCAT44(extraout_var,iVar2),Checked,&local_58,0,
                              (char *)0x0);
      if (iVar2 != 0) {
        pCVar3[2].m_Flags = (int)uVar4;
        if (pCVar3[2].m_Readonly == false) {
          s_AutoMapProceedOrder = 1;
        }
        break;
      }
      uVar4 = uVar4 + 1;
      iVar2 = (*(this->m_Map).m_lImages.list[*(int *)&pCVar3[1].m_pEditor]->m_pAutoMapper->
                _vptr_IAutoMapper[5])();
      pID = pID + 1;
    } while ((long)uVar4 < (long)iVar2);
  }
  CUIRect::HSplitTop(&local_48,2.0,(CUIRect *)0x0,&local_48);
  CUIRect::VSplitMid(&local_48,&local_68,&local_48,0.0);
  CUI::DoLabel(&this->m_UI,&local_68,"Type",10.0,0,-1.0,true);
  CUIRect::VSplitMid(&local_48,&local_78,&local_88,0.0);
  iVar2 = DoButton_ButtonDec(this,PopupSelectConfigAutoMap::s_aIds,"Full",pCVar3[2].m_Readonly ^ 1,
                             &local_78,0,"");
  if (iVar2 != 0) {
    pCVar3[2].m_Readonly = false;
  }
  iVar2 = DoButton_ButtonInc(this,(void *)((long)PopupSelectConfigAutoMap::s_aIds + 1),"Live",
                             (uint)pCVar3[2].m_Readonly,&local_88,0,"");
  if (iVar2 != 0) {
    pCVar3[2].m_Readonly = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool CEditor::PopupSelectConfigAutoMap(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CLayerTiles *pLayer = static_cast<CLayerTiles*>(pEditor->GetSelectedLayer(0));
	CUIRect Button;
	static int s_AutoMapperConfigButtons[IAutoMapper::MAX_RULES];

	for(int i = 0; i < pEditor->m_Map.m_lImages[pLayer->m_Image]->m_pAutoMapper->RuleSetNum(); ++i)
	{
		View.HSplitTop(2.0f, 0, &View);
		View.HSplitTop(12.0f, &Button, &View);
		if(pEditor->DoButton_Editor(&s_AutoMapperConfigButtons[i], pEditor->m_Map.m_lImages[pLayer->m_Image]->m_pAutoMapper->GetRuleSetName(i), pLayer->m_LiveAutoMap && pLayer->m_SelectedRuleSet == i, &Button, 0, 0))
		{
			pLayer->m_SelectedRuleSet = i;
			if(!pLayer->m_LiveAutoMap)
				s_AutoMapProceedOrder = true;
			break;
		}
	}

	View.HSplitTop(2.0f, 0, &View);

	static int s_aIds[2] = {0};

	CUIRect Label, Full, Live;
	View.VSplitMid(&Label, &View);
	pEditor->UI()->DoLabel(&Label, "Type", 10.0f, TEXTALIGN_LEFT);

	View.VSplitMid(&Full, &Live);
	if(pEditor->DoButton_ButtonDec(&s_aIds[0], "Full", !pLayer->m_LiveAutoMap, &Full, 0, ""))
	{
		pLayer->m_LiveAutoMap = false;
	}
	if(pEditor->DoButton_ButtonInc(((char *)&s_aIds[0])+1, "Live", pLayer->m_LiveAutoMap, &Live, 0, ""))
	{
		pLayer->m_LiveAutoMap = true;
	}

	return false;
}